

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

string * __thiscall
TgBot::TgTypeParser::parseInlineQueryResultCachedMpeg4Gif_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  string *this_00;
  allocator local_31;
  string local_30;
  
  if ((object->
      super___shared_ptr<TgBot::InlineQueryResultCachedMpeg4Gif,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      == (element_type *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_30);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    this_00 = &local_30;
    std::__cxx11::string::string((string *)this_00,"mpeg4_file_id",&local_31);
    appendToJson((TgTypeParser *)this_00,__return_storage_ptr__,&local_30,
                 &((object->
                   super___shared_ptr<TgBot::InlineQueryResultCachedMpeg4Gif,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->mpeg4FileId);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TgTypeParser::parseInlineQueryResultCachedMpeg4Gif(const InlineQueryResultCachedMpeg4Gif::Ptr& object) const {
    if (!object){
        return "";
    }
    // This function will be called by parseInlineQueryResult(), so I don't add
    // curly brackets to the result string.
    string result;
    appendToJson(result, "mpeg4_file_id", object->mpeg4FileId);
    // The last comma will be erased by parseInlineQueryResult().
    return result;
}